

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_write_file_def(cram_fd *fd,cram_file_def *def)

{
  int iVar1;
  ssize_t sVar2;
  cram_file_def *def_local;
  cram_fd *fd_local;
  
  sVar2 = hwrite(fd->fp,def,0x1a);
  iVar1 = -1;
  if (sVar2 == 0x1a) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int cram_write_file_def(cram_fd *fd, cram_file_def *def) {
    return (hwrite(fd->fp, &def->magic[0], 26) == 26) ? 0 : -1;
}